

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  RepeatedField<int> *pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Rep *pRVar5;
  Location *pLVar6;
  SourceCodeInfo_Location *obj;
  Location *pLVar7;
  int *piVar8;
  int tmp;
  
  this->parser_ = parent->parser_;
  this->source_code_info_ = source_code_info;
  pRVar5 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    iVar2 = (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar5->allocated_size) {
      (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pLVar7 = (Location *)pRVar5->elements[iVar2];
      goto LAB_0033f90c;
    }
  }
  obj = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo_Location>
                  ((source_code_info->location_).super_RepeatedPtrFieldBase.arena_);
  pLVar7 = (Location *)
           internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(source_code_info->location_).super_RepeatedPtrFieldBase,obj);
LAB_0033f90c:
  this->location_ = pLVar7;
  pLVar6 = parent->location_;
  if (pLVar6 != pLVar7) {
    (pLVar7->path_).current_size_ = 0;
    RepeatedField<int>::MergeFrom(&pLVar7->path_,&pLVar6->path_);
  }
  pLVar7 = this->location_;
  iVar2 = (this->parser_->input_->current_).line;
  pRVar1 = &pLVar7->span_;
  uVar3 = (pLVar7->span_).current_size_;
  uVar4 = (pLVar7->span_).total_size_;
  if (uVar3 == uVar4) {
    RepeatedField<int>::Reserve(pRVar1,uVar4 + 1);
  }
  piVar8 = RepeatedField<int>::elements(pRVar1);
  piVar8[uVar3] = iVar2;
  pRVar1->current_size_ = uVar3 + 1;
  pLVar7 = this->location_;
  iVar2 = (this->parser_->input_->current_).column;
  pRVar1 = &pLVar7->span_;
  uVar3 = (pLVar7->span_).current_size_;
  uVar4 = (pLVar7->span_).total_size_;
  if (uVar3 == uVar4) {
    RepeatedField<int>::Reserve(pRVar1,uVar4 + 1);
  }
  piVar8 = RepeatedField<int>::elements(pRVar1);
  piVar8[uVar3] = iVar2;
  pRVar1->current_size_ = uVar3 + 1;
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}